

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Aig_Man_t * Saig_ManCreateMiter(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  uint __line;
  Aig_Man_t *p;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  
  if ((p0->nRegs < 1) && (p1->nRegs < 1)) {
    pcVar2 = "Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0";
    __line = 0x69;
  }
  else if (p0->nTruePis == p1->nTruePis) {
    if (p0->nTruePos == p1->nTruePos) {
      p = Aig_ManStart(p1->vObjs->nSize + p0->vObjs->nSize);
      pcVar2 = Abc_UtilStrsav("miter");
      p->pName = pcVar2;
      Aig_ManCleanData(p0);
      Aig_ManCleanData(p1);
      aVar1 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
      p0->pConst1->field_5 = aVar1;
      p1->pConst1->field_5 = aVar1;
      for (iVar7 = 0; iVar7 < p0->nTruePis; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p0->vCis,iVar7);
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (iVar7 = 0; iVar7 < p1->nTruePis; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p1->vCis,iVar7);
        pAVar4 = Aig_ManCi(p,iVar7);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (iVar7 = 0; iVar7 < p0->nRegs; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p0->vCis,p0->nTruePis + iVar7);
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (iVar7 = 0; iVar7 < p1->nRegs; iVar7 = iVar7 + 1) {
        pvVar3 = Vec_PtrEntry(p1->vCis,p1->nTruePis + iVar7);
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (iVar7 = 0; iVar7 < p0->vObjs->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,iVar7);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          pAVar6 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And(p,pAVar5,pAVar6);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      for (iVar7 = 0; iVar7 < p1->vObjs->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,iVar7);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          pAVar6 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And(p,pAVar5,pAVar6);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      iVar7 = 0;
      do {
        if (p0->nTruePos <= iVar7) {
          for (iVar7 = 0; iVar7 < p0->nRegs; iVar7 = iVar7 + 1) {
            pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,p0->nTruePos + iVar7);
            pAVar5 = Aig_ObjChild0Copy(pAVar4);
            pAVar5 = Aig_ObjCreateCo(p,pAVar5);
            (pAVar4->field_5).pData = pAVar5;
          }
          for (iVar7 = 0; iVar7 < p1->nRegs; iVar7 = iVar7 + 1) {
            pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p1->vCos,p1->nTruePos + iVar7);
            pAVar5 = Aig_ObjChild0Copy(pAVar4);
            pAVar5 = Aig_ObjCreateCo(p,pAVar5);
            (pAVar4->field_5).pData = pAVar5;
          }
          Aig_ManSetRegNum(p,p1->nRegs + p0->nRegs);
          return p;
        }
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,iVar7);
        if (Oper == 1) {
          pAVar4 = Aig_ObjChild0Copy(pAVar4);
          pAVar5 = Aig_ManCo(p1,iVar7);
          pAVar5 = Aig_ObjChild0Copy(pAVar5);
          pAVar4 = Aig_And(p,pAVar4,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
        }
        else {
          if (Oper != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                          ,0x8a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
          }
          pAVar4 = Aig_ObjChild0Copy(pAVar4);
          pAVar5 = Aig_ManCo(p1,iVar7);
          pAVar5 = Aig_ObjChild0Copy(pAVar5);
          pAVar4 = Aig_Exor(p,pAVar4,pAVar5);
        }
        Aig_ObjCreateCo(p,pAVar4);
        iVar7 = iVar7 + 1;
      } while( true );
    }
    pcVar2 = "Saig_ManPoNum(p0) == Saig_ManPoNum(p1)";
    __line = 0x6b;
  }
  else {
    pcVar2 = "Saig_ManPiNum(p0) == Saig_ManPiNum(p1)";
    __line = 0x6a;
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                ,__line,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManCreateMiter( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0 );
    assert( Saig_ManPiNum(p0) == Saig_ManPiNum(p1) );
    assert( Saig_ManPoNum(p0) == Saig_ManPoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs
    Saig_ManForEachPi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachPi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map register outputs
    Saig_ManForEachLo( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Saig_ManForEachPo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // create register inputs
    Saig_ManForEachLi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // cleanup
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p0) + Saig_ManRegNum(p1) );
//    Aig_ManCleanup( pNew );
    return pNew;
}